

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall defyx::JitCompilerX86::h_FADD_M(JitCompilerX86 *this,Instruction *instr,int i)

{
  undefined4 in_EDX;
  JitCompilerX86 *in_RSI;
  JitCompilerX86 *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  JitCompilerX86 *pJVar1;
  
  *(byte *)((long)&(in_RSI->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start + 1) =
       *(byte *)((long)&(in_RSI->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start + 1) % 4;
  pJVar1 = in_RSI;
  genAddressReg(in_RSI,(Instruction *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                SUB81((ulong)in_RDI >> 0x38,0));
  emit<6ul>(in_RDI,(uint8_t (*) [6])in_RSI);
  emit<4ul>(in_RDI,(uint8_t (*) [4])in_RSI);
  emitByte(in_RDI,*(char *)((long)&(pJVar1->instructionOffsets).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + 1) * '\b' + 0xc4);
  return;
}

Assistant:

void JitCompilerX86::h_FADD_M(Instruction& instr, int i) {
		instr.dst %= RegisterCountFlt;
		genAddressReg(instr);
		emit(REX_CVTDQ2PD_XMM12);
		emit(REX_ADDPD);
		emitByte(0xc4 + 8 * instr.dst);
	}